

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

void __thiscall ncnn::Mat::to_pixels(Mat *this,uchar *pixels,int type,int stride)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar uVar4;
  int iVar5;
  float *pfVar6;
  int iVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  uchar *puVar12;
  int iVar13;
  int iVar14;
  
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      iVar2 = stride + this->w * -3;
      iVar1 = this->h;
      iVar7 = 1;
      if (iVar2 == 0) {
        iVar1 = 1;
        iVar7 = this->h;
      }
      if (0 < iVar1) {
        iVar7 = iVar7 * this->w;
        lVar9 = this->elemsize * this->cstep;
        pfVar8 = (float *)this->data;
        pfVar6 = (float *)((long)pfVar8 + lVar9 * 2);
        pfVar10 = (float *)(lVar9 + (long)pfVar8);
        iVar5 = 0;
        iVar14 = 0;
        puVar12 = pixels;
        do {
          iVar13 = iVar7 + 1;
          if (0 < iVar7) {
            do {
              iVar3 = (int)*pfVar8;
              if ((int)*pfVar8 < 1) {
                iVar3 = iVar5;
              }
              if (0xfe < iVar3) {
                iVar3 = 0xff;
              }
              *puVar12 = (uchar)iVar3;
              iVar3 = (int)*pfVar10;
              if ((int)*pfVar10 < 1) {
                iVar3 = iVar5;
              }
              if (0xfe < iVar3) {
                iVar3 = 0xff;
              }
              puVar12[1] = (uchar)iVar3;
              iVar3 = (int)*pfVar6;
              if ((int)*pfVar6 < 1) {
                iVar3 = iVar5;
              }
              if (0xfe < iVar3) {
                iVar3 = 0xff;
              }
              puVar12[2] = (uchar)iVar3;
              puVar12 = puVar12 + 3;
              pfVar8 = pfVar8 + 1;
              pfVar10 = pfVar10 + 1;
              pfVar6 = pfVar6 + 1;
              iVar13 = iVar13 + -1;
            } while (1 < iVar13);
          }
          puVar12 = puVar12 + iVar2;
          iVar14 = iVar14 + 1;
        } while (iVar14 != iVar1);
      }
    }
    if (type == 3) {
      iVar2 = stride - this->w;
      iVar1 = this->h;
      iVar7 = 1;
      if (iVar2 == 0) {
        iVar1 = 1;
        iVar7 = this->h;
      }
      if (0 < iVar1) {
        iVar7 = iVar7 * this->w;
        pfVar6 = (float *)this->data;
        iVar5 = 0;
        puVar12 = pixels;
        do {
          iVar14 = iVar7 + 1;
          if (0 < iVar7) {
            do {
              iVar13 = (int)*pfVar6;
              if ((int)*pfVar6 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              *puVar12 = (uchar)iVar13;
              puVar12 = puVar12 + 1;
              pfVar6 = pfVar6 + 1;
              iVar14 = iVar14 + -1;
            } while (1 < iVar14);
          }
          puVar12 = puVar12 + iVar2;
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar1);
      }
    }
    if ((type & 0xfffeU) == 4) {
      iVar2 = stride + this->w * -4;
      iVar1 = this->h;
      iVar7 = 1;
      if (iVar2 == 0) {
        iVar1 = 1;
        iVar7 = this->h;
      }
      if (0 < iVar1) {
        iVar7 = iVar7 * this->w;
        pfVar8 = (float *)this->data;
        lVar9 = this->elemsize * this->cstep;
        pfVar10 = (float *)(lVar9 * 3 + (long)pfVar8);
        pfVar6 = (float *)((long)pfVar8 + lVar9 * 2);
        pfVar11 = (float *)(lVar9 + (long)pfVar8);
        iVar5 = 0;
        do {
          iVar14 = iVar7 + 1;
          if (0 < iVar7) {
            do {
              iVar13 = (int)*pfVar8;
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              *pixels = (uchar)iVar13;
              iVar13 = (int)*pfVar11;
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              pixels[1] = (uchar)iVar13;
              iVar13 = (int)*pfVar6;
              if ((int)*pfVar6 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              pixels[2] = (uchar)iVar13;
              iVar13 = (int)*pfVar10;
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              pixels[3] = (uchar)iVar13;
              pixels = pixels + 4;
              pfVar8 = pfVar8 + 1;
              pfVar11 = pfVar11 + 1;
              pfVar6 = pfVar6 + 1;
              pfVar10 = pfVar10 + 1;
              iVar14 = iVar14 + -1;
            } while (1 < iVar14);
          }
          pixels = pixels + iVar2;
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar1);
        return;
      }
      return;
    }
    return;
  }
  if (type < 0x50001) {
    switch(type) {
    case 0x40001:
switchD_00137715_caseD_40001:
      iVar2 = stride + this->w * -4;
      iVar1 = this->h;
      iVar7 = 1;
      if (iVar2 == 0) {
        iVar1 = 1;
        iVar7 = this->h;
      }
      if (iVar1 < 1) {
        return;
      }
      iVar7 = iVar7 * this->w;
      pfVar8 = (float *)this->data;
      lVar9 = this->elemsize * this->cstep;
      pfVar6 = (float *)((long)pfVar8 + lVar9 * 2);
      pfVar10 = (float *)(lVar9 + (long)pfVar8);
      iVar5 = 0;
      do {
        iVar14 = iVar7 + 1;
        if (0 < iVar7) {
          do {
            iVar13 = (int)*pfVar8;
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            *pixels = (uchar)iVar13;
            iVar13 = (int)*pfVar10;
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            pixels[1] = (uchar)iVar13;
            iVar13 = (int)*pfVar6;
            if ((int)*pfVar6 < 1) {
              iVar13 = 0;
            }
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            pixels[2] = (uchar)iVar13;
            pixels[3] = 0xff;
            pixels = pixels + 4;
            pfVar8 = pfVar8 + 1;
            pfVar10 = pfVar10 + 1;
            pfVar6 = pfVar6 + 1;
            iVar14 = iVar14 + -1;
          } while (1 < iVar14);
        }
        pixels = pixels + iVar2;
        iVar5 = iVar5 + 1;
      } while (iVar5 != iVar1);
      return;
    case 0x40002:
switchD_00137715_caseD_40002:
      iVar2 = stride + this->w * -4;
      iVar1 = this->h;
      iVar7 = 1;
      if (iVar2 == 0) {
        iVar1 = 1;
        iVar7 = this->h;
      }
      if (0 < iVar1) {
        iVar7 = iVar7 * this->w;
        pfVar8 = (float *)this->data;
        lVar9 = this->elemsize * this->cstep;
        pfVar6 = (float *)((long)pfVar8 + lVar9 * 2);
        pfVar10 = (float *)(lVar9 + (long)pfVar8);
        iVar5 = 0;
        do {
          iVar14 = iVar7 + 1;
          if (0 < iVar7) {
            do {
              iVar13 = (int)*pfVar6;
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              *pixels = (uchar)iVar13;
              iVar13 = (int)*pfVar10;
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              pixels[1] = (uchar)iVar13;
              iVar13 = (int)*pfVar8;
              if ((int)*pfVar8 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              pixels[2] = (uchar)iVar13;
              pixels[3] = 0xff;
              pixels = pixels + 4;
              pfVar8 = pfVar8 + 1;
              pfVar10 = pfVar10 + 1;
              pfVar6 = pfVar6 + 1;
              iVar14 = iVar14 + -1;
            } while (1 < iVar14);
          }
          pixels = pixels + iVar2;
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar1);
      }
      break;
    case 0x40003:
switchD_00137715_caseD_40003:
      iVar2 = stride + this->w * -4;
      iVar1 = 1;
      iVar7 = this->h;
      if (iVar2 == 0) {
        iVar1 = this->h;
        iVar7 = 1;
      }
      if (0 < iVar7) {
        iVar1 = iVar1 * this->w;
        pfVar6 = (float *)this->data;
        iVar5 = 0;
        do {
          iVar14 = iVar1 + 1;
          if (0 < iVar1) {
            do {
              iVar13 = (int)*pfVar6;
              if ((int)*pfVar6 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              uVar4 = (uchar)iVar13;
              *pixels = uVar4;
              pixels[1] = uVar4;
              pixels[2] = uVar4;
              pixels[3] = 0xff;
              pixels = pixels + 4;
              pfVar6 = pfVar6 + 1;
              iVar14 = iVar14 + -1;
            } while (1 < iVar14);
          }
          pixels = pixels + iVar2;
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar7);
        return;
      }
      return;
    case 0x40005:
switchD_00137715_caseD_40005:
      iVar2 = stride + this->w * -4;
      iVar1 = this->h;
      iVar7 = 1;
      if (iVar2 == 0) {
        iVar1 = 1;
        iVar7 = this->h;
      }
      if (0 < iVar1) {
        iVar7 = iVar7 * this->w;
        pfVar8 = (float *)this->data;
        lVar9 = this->elemsize * this->cstep;
        pfVar10 = (float *)(lVar9 * 3 + (long)pfVar8);
        pfVar6 = (float *)((long)pfVar8 + lVar9 * 2);
        pfVar11 = (float *)(lVar9 + (long)pfVar8);
        iVar5 = 0;
        do {
          iVar14 = iVar7 + 1;
          if (0 < iVar7) {
            do {
              iVar13 = (int)*pfVar6;
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              *pixels = (uchar)iVar13;
              iVar13 = (int)*pfVar11;
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              pixels[1] = (uchar)iVar13;
              iVar13 = (int)*pfVar8;
              if ((int)*pfVar8 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              pixels[2] = (uchar)iVar13;
              iVar13 = (int)*pfVar10;
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              pixels[3] = (uchar)iVar13;
              pixels = pixels + 4;
              pfVar8 = pfVar8 + 1;
              pfVar11 = pfVar11 + 1;
              pfVar6 = pfVar6 + 1;
              pfVar10 = pfVar10 + 1;
              iVar14 = iVar14 + -1;
            } while (1 < iVar14);
          }
          pixels = pixels + iVar2;
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar1);
        return;
      }
      return;
    default:
      if ((type == 0x10002) || (type == 0x20001)) {
        iVar2 = stride + this->w * -3;
        iVar1 = this->h;
        iVar7 = 1;
        if (iVar2 == 0) {
          iVar1 = 1;
          iVar7 = this->h;
        }
        if (0 < iVar1) {
          iVar7 = iVar7 * this->w;
          pfVar8 = (float *)this->data;
          lVar9 = this->elemsize * this->cstep;
          pfVar6 = (float *)((long)pfVar8 + lVar9 * 2);
          pfVar10 = (float *)(lVar9 + (long)pfVar8);
          iVar5 = 0;
          do {
            iVar14 = iVar7 + 1;
            if (0 < iVar7) {
              do {
                iVar13 = (int)*pfVar8;
                if (iVar13 < 1) {
                  iVar13 = 0;
                }
                if (0xfe < iVar13) {
                  iVar13 = 0xff;
                }
                pixels[2] = (uchar)iVar13;
                iVar13 = (int)*pfVar10;
                if (iVar13 < 1) {
                  iVar13 = 0;
                }
                if (0xfe < iVar13) {
                  iVar13 = 0xff;
                }
                pixels[1] = (uchar)iVar13;
                iVar13 = (int)*pfVar6;
                if ((int)*pfVar6 < 1) {
                  iVar13 = 0;
                }
                if (0xfe < iVar13) {
                  iVar13 = 0xff;
                }
                *pixels = (uchar)iVar13;
                pixels = pixels + 3;
                pfVar8 = pfVar8 + 1;
                pfVar10 = pfVar10 + 1;
                pfVar6 = pfVar6 + 1;
                iVar14 = iVar14 + -1;
              } while (1 < iVar14);
            }
            pixels = pixels + iVar2;
            iVar5 = iVar5 + 1;
          } while (iVar5 != iVar1);
          return;
        }
        return;
      }
    case 0x40004:
switchD_00137715_caseD_40004:
      to_pixels();
    }
    return;
  }
  switch(type) {
  case 0x50001:
    goto switchD_00137715_caseD_40002;
  case 0x50002:
    goto switchD_00137715_caseD_40001;
  case 0x50003:
    goto switchD_00137715_caseD_40003;
  case 0x50004:
    goto switchD_00137715_caseD_40005;
  default:
    goto switchD_00137715_caseD_40004;
  }
}

Assistant:

void Mat::to_pixels(unsigned char* pixels, int type, int stride) const
{
    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            to_bgr2rgb(*this, pixels, stride);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            to_rgb2rgba(*this, pixels, stride);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            to_bgr2rgba(*this, pixels, stride);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            to_gray2rgba(*this, pixels, stride);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            to_rgba2bgra(*this, pixels, stride);
            break;
        default:
            // unimplemented convert type
            NCNN_LOGE("unimplemented convert type %d", type);
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            to_rgb(*this, pixels, stride);

        if (type == PIXEL_GRAY)
            to_gray(*this, pixels, stride);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            to_rgba(*this, pixels, stride);
    }
}